

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void printLevelRoundingMode(LevelRoundingMode lm)

{
  long lVar1;
  char *pcVar2;
  
  if (lm == ROUND_UP) {
    pcVar2 = "up";
    lVar1 = 2;
  }
  else {
    if (lm != ROUND_DOWN) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mode ",5);
      std::ostream::operator<<((ostream *)&std::cout,lm);
      return;
    }
    pcVar2 = "down";
    lVar1 = 4;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar2,lVar1);
  return;
}

Assistant:

void
printLevelRoundingMode (LevelRoundingMode lm)
{
    switch (lm)
    {
        case ROUND_DOWN: cout << "down"; break;

        case ROUND_UP: cout << "up"; break;

        default: cout << "mode " << int (lm); break;
    }
}